

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void N_VPrintFile_Serial(N_Vector x,FILE *outfile)

{
  long lVar1;
  long lVar2;
  FILE *in_RSI;
  long *in_RDI;
  sunrealtype *xd;
  sunindextype N;
  sunindextype i;
  long local_18;
  
  lVar1 = *(long *)*in_RDI;
  lVar2 = *(long *)(*in_RDI + 0x10);
  for (local_18 = 0; local_18 < lVar1; local_18 = local_18 + 1) {
    fprintf(in_RSI,"%19.16e\n",*(undefined8 *)(lVar2 + local_18 * 8));
  }
  fprintf(in_RSI,"\n");
  return;
}

Assistant:

void N_VPrintFile_Serial(N_Vector x, FILE* outfile)
{
  sunindextype i, N;
  sunrealtype* xd;

  xd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  for (i = 0; i < N; i++)
  {
#if defined(SUNDIALS_EXTENDED_PRECISION)
    fprintf(outfile, "%35.32Le\n", xd[i]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    fprintf(outfile, "%19.16e\n", xd[i]);
#else
    fprintf(outfile, "%11.8e\n", xd[i]);
#endif
  }
  fprintf(outfile, "\n");

  return;
}